

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

bitcount_t tc_uECC_vli_numBits(tc_uECC_word_t *vli,wordcount_t max_words)

{
  int iVar1;
  short sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar5 = (ulong)(byte)max_words;
  iVar1 = (uint)(byte)max_words << 0x18;
  do {
    iVar6 = iVar1;
    uVar4 = uVar5;
    uVar5 = uVar4 - 1;
    if ((char)uVar5 < '\0') break;
    iVar1 = iVar6 + -0x1000000;
  } while (vli[(uint)uVar5 & 0x7f] == 0);
  if (uVar4 == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = (char)uVar4 * 0x20 + -0x20;
    for (uVar3 = vli[(long)(iVar6 >> 0x18) + -1]; uVar3 != 0; uVar3 = uVar3 >> 1) {
      sVar2 = sVar2 + 1;
    }
  }
  return sVar2;
}

Assistant:

bitcount_t tc_uECC_vli_numBits(const tc_uECC_word_t *vli,
			    const wordcount_t max_words)
{

	tc_uECC_word_t i;
	tc_uECC_word_t digit;

	wordcount_t num_digits = vli_numDigits(vli, max_words);
	if (num_digits == 0) {
		return 0;
	}

	digit = vli[num_digits - 1];
	for (i = 0; digit; ++i) {
		digit >>= 1;
	}

	return (((bitcount_t)(num_digits - 1) << tc_uECC_WORD_BITS_SHIFT) + i);
}